

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void syntax_tests::ExceptionFunction(int i)

{
  bad_exception *this;
  undefined8 *puVar1;
  string *this_00;
  undefined4 *puVar2;
  allocator<char> local_d;
  int local_c;
  int i_local;
  
  local_c = i;
  switch(i) {
  case 0:
    break;
  case 1:
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 2;
    __cxa_throw(puVar2,&int::typeinfo,0);
  case 2:
    this = (bad_exception *)__cxa_allocate_exception(8);
    std::bad_exception::bad_exception(this);
    __cxa_throw(this,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
  case 3:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "error";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  case 4:
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,"error",&local_d);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  case 5:
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0x3dcccccd;
    __cxa_throw(puVar2,&float::typeinfo,0);
  }
  return;
}

Assistant:

static void ExceptionFunction(int i)
{
    switch( i )
    {
    case 0:
        return;
    case 1:
        throw 2;
    case 2:
        throw ::std::bad_exception();
    case 3:
        throw "error";
    case 4:
        throw ::std::string("error");
    case 5:
        throw 0.1f;
    default:
        break;
    }
}